

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pong.cpp
# Opt level: O0

void start_game_proc(Am_Object *param_1)

{
  int iVar1;
  uint uVar2;
  Am_Value *pAVar3;
  Am_Object local_38;
  undefined4 local_30;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *param_0_local;
  
  local_10 = param_1;
  Am_Object::Set(0xa2d8,true,0);
  pAVar3 = (Am_Value *)Am_Object::Get(0xa2b0,0x66);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::Set(0xa2d0,100,(long)(iVar1 + -0x15) / 2 & 0xffffffff);
  pAVar3 = (Am_Value *)Am_Object::Get(0xa2b8,0x67);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::Set(0xa2d0,0x65,(long)(iVar1 + -0x15) / 2 & 0xffffffff);
  Am_Object::Set(0xa2d0,true,1);
  pAVar3 = (Am_Value *)Am_Object::Get(0xa2b8,0x67);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::Set(0xa2c0,0x65,(long)(iVar1 + -0x3c) / 2 & 0xffffffff);
  pAVar3 = (Am_Value *)Am_Object::Get(0xa2b8,0x67);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::Set(0xa2c8,0x65,(long)(iVar1 + -0x3c) / 2 & 0xffffffff);
  uVar2 = rand();
  y_offset = (uVar2 & 7) + 1;
  uVar2 = rand();
  if ((uVar2 & 1) != 0) {
    y_offset = -y_offset;
  }
  uVar2 = rand();
  x_offset = (uVar2 & 7) + 1;
  if ((player1sturn & 1U) != 0) {
    x_offset = -x_offset;
  }
  Am_Object::Am_Object(&local_18,(Am_Object *)&anim);
  Am_Object::Am_Object(&local_20,(Am_Object *)&Am_No_Object);
  local_30 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_38,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor(&local_18,&local_20,local_30,&local_38,0,0,1);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, start_game, (Am_Object /*cmd*/))
{
  start_button.Set(Am_VISIBLE, false);
  ball.Set(Am_LEFT, (int)((int)window.Get(Am_WIDTH) - ball_size) / 2);
  ball.Set(Am_TOP, (int)((int)main_group.Get(Am_HEIGHT) - ball_size) / 2);
  ball.Set(Am_VISIBLE, true);
  paddle1.Set(Am_TOP,
              (int)((int)main_group.Get(Am_HEIGHT) - paddle_height) / 2);
  paddle2.Set(Am_TOP,
              (int)((int)main_group.Get(Am_HEIGHT) - paddle_height) / 2);
  y_offset = (rand() & 7) + 1;
  if (rand() & 1)
    y_offset = -y_offset;
  x_offset = (rand() & 7) + 1;
  if (player1sturn)
    x_offset = -x_offset;
  Am_Start_Interactor(anim);
}